

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

tc_toktyp_t __thiscall CTcTokenizer::next(CTcTokenizer *this)

{
  CTcToken *pCVar1;
  CTcTokenEle *pCVar2;
  CTcTokenSource *pCVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  char *pcVar9;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  tc_toktyp_t tVar13;
  wchar_t wVar14;
  undefined4 extraout_var;
  tc_toktyp_t unaff_EBP;
  undefined8 *puVar15;
  
  pCVar1 = &this->curtok_;
  (this->prvtok_).field_0x20 = (this->curtok_).field_0x20;
  tVar13 = (this->curtok_).typ_;
  uVar4 = *(undefined4 *)&(this->curtok_).field_0x4;
  uVar5 = *(undefined4 *)&(this->curtok_).text_;
  uVar6 = *(undefined4 *)((long)&(this->curtok_).text_ + 4);
  uVar7 = *(undefined4 *)((long)&(this->curtok_).text_len_ + 4);
  uVar11 = (this->curtok_).int_val_;
  uVar8 = *(undefined4 *)((long)&(this->curtok_).int_val_ + 4);
  *(int *)&(this->prvtok_).text_len_ = (int)(this->curtok_).text_len_;
  *(undefined4 *)((long)&(this->prvtok_).text_len_ + 4) = uVar7;
  *(int *)&(this->prvtok_).int_val_ = (int)uVar11;
  *(undefined4 *)((long)&(this->prvtok_).int_val_ + 4) = uVar8;
  (this->prvtok_).typ_ = tVar13;
  *(undefined4 *)&(this->prvtok_).field_0x4 = uVar4;
  *(undefined4 *)&(this->prvtok_).text_ = uVar5;
  *(undefined4 *)((long)&(this->prvtok_).text_ + 4) = uVar6;
  pCVar2 = this->unget_cur_;
  if (pCVar2 == (CTcTokenEle *)0x0) {
    if (this->ext_src_ == (CTcTokenSource *)0x0) {
      do {
        tVar13 = next_on_line_xlat_keep(this);
        if (tVar13 == TOKT_NULLTOK) {
          iVar12 = 0;
        }
        else if (tVar13 == TOKT_EOF) {
          wVar14 = utf8_ptr::s_getch((this->p_).p_);
          if (wVar14 == L'\x04') {
            iVar12 = 1;
            unaff_EBP = TOKT_EOF;
          }
          else {
            iVar12 = read_line_pp(this);
            if (iVar12 != 0) {
              unaff_EBP = TOKT_EOF;
            }
          }
        }
        else {
          iVar12 = 1;
          unaff_EBP = tVar13;
        }
      } while ((char)iVar12 == '\0');
      return unaff_EBP;
    }
    iVar12 = (*this->ext_src_->_vptr_CTcTokenSource[2])();
    puVar15 = (undefined8 *)CONCAT44(extraout_var,iVar12);
    if (puVar15 != (undefined8 *)0x0) {
      pcVar9 = (char *)puVar15[1];
      sVar10 = puVar15[2];
      uVar11 = puVar15[3];
      *(undefined8 *)pCVar1 = *puVar15;
      (this->curtok_).text_ = pcVar9;
      (this->curtok_).field_0x20 = *(undefined1 *)(puVar15 + 4);
      (this->curtok_).text_len_ = sVar10;
      (this->curtok_).int_val_ = uVar11;
      return pCVar1->typ_;
    }
    pCVar3 = this->ext_src_;
    (this->curtok_).field_0x20 = (pCVar3->enclosing_curtok_).field_0x20;
    tVar13 = (pCVar3->enclosing_curtok_).typ_;
    uVar4 = *(undefined4 *)&(pCVar3->enclosing_curtok_).field_0x4;
    pcVar9 = (pCVar3->enclosing_curtok_).text_;
    uVar11 = (pCVar3->enclosing_curtok_).int_val_;
    (this->curtok_).text_len_ = (pCVar3->enclosing_curtok_).text_len_;
    (this->curtok_).int_val_ = uVar11;
    pCVar1->typ_ = tVar13;
    *(undefined4 *)&pCVar1->field_0x4 = uVar4;
    (this->curtok_).text_ = pcVar9;
    this->ext_src_ = pCVar3->enclosing_src_;
  }
  else {
    (this->curtok_).field_0x20 = (pCVar2->super_CTcToken).field_0x20;
    tVar13 = (pCVar2->super_CTcToken).typ_;
    uVar4 = *(undefined4 *)&(pCVar2->super_CTcToken).field_0x4;
    pcVar9 = (pCVar2->super_CTcToken).text_;
    uVar11 = (pCVar2->super_CTcToken).int_val_;
    (this->curtok_).text_len_ = (pCVar2->super_CTcToken).text_len_;
    (this->curtok_).int_val_ = uVar11;
    pCVar1->typ_ = tVar13;
    *(undefined4 *)&pCVar1->field_0x4 = uVar4;
    (this->curtok_).text_ = pcVar9;
    this->unget_cur_ = pCVar2->prv_;
  }
  return (this->curtok_).typ_;
}

Assistant:

tc_toktyp_t CTcTokenizer::next()
{
    /* the current token is about to become the previous token */
    prvtok_ = curtok_;
    
    /* if there's an un-got token, return it */
    if (unget_cur_ != 0)
    {
        /* get the current unget token */
        curtok_ = *unget_cur_;

        /* we've now consumed this ungotten token */
        unget_cur_ = unget_cur_->getprv();

        /* return the new token's type */
        return curtok_.gettyp();
    }

    /* if there's an external source, get its next token */
    if (ext_src_ != 0)
    {
        const CTcToken *ext_tok;

        /* get the next token from the external source */
        ext_tok = ext_src_->get_next_token();

        /* check to see if we got a token */
        if (ext_tok == 0)
        {
            /* 
             *   restore the current token in effect before this source was
             *   active 
             */
            curtok_ = *ext_src_->get_enclosing_curtok();

            /* 
             *   this source has no more tokens - restore the enclosing
             *   source, and keep going so we try getting a token from it 
             */
            ext_src_ = ext_src_->get_enclosing_source();

            /* return the token type */
            return curtok_.gettyp();
        }
        else
        {
            /* we got a token - copy it to our internal token buffer */
            curtok_ = *ext_tok;

            /* return its type */
            return curtok_.gettyp();
        }
    }
    
    /* keep going until we get a valid token */
    for (;;)
    {
        /* 
         *   read the next token from the current line, applying
         *   appropriate string translations and storing strings and
         *   symbols in the source block list 
         */
        tc_toktyp_t typ = next_on_line_xlat_keep();

        /* if it's the "null" token, skip it and read another token */
        if (typ == TOKT_NULLTOK)
            continue;

        /* if we found a valid token, we're done - return the token */
        if (typ != TOKT_EOF)
            return typ;

        /* 
         *   if we're at the end of a preprocess line, don't read another
         *   line - just return end of file 
         */
        if (p_.getch() == TOK_END_PP_LINE)
            return TOKT_EOF;

        /* 
         *   we've reached the end of the line - read another line,
         *   applying preprocessing directives and expanding macros as
         *   needed 
         */
        if (read_line_pp())
        {
            /* no more lines are available - return end of file */
            return TOKT_EOF;
        }
    }
}